

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

void density_tests::detail::
     PutTestObject<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>,_128UL,_8UL>
     ::reentrant_consume(reentrant_consume_operation *i_consume)

{
  runtime_type<> *prVar1;
  TestObject<128UL,_8UL> *this;
  
  prVar1 = density::
           lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
           ::reentrant_consume_operation::complete_type((reentrant_consume_operation *)i_consume);
  if (prVar1->m_feature_table !=
      (tuple_type *)
      density::detail::
      FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<128ul,8ul>>
      ::s_table) {
    assert_failed<>("i_consume.complete_type().template is<ElementType>()",
                    "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/generic_tests/queue_generic_tests.h"
                    ,0x156);
  }
  this = density::
         lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
         ::reentrant_consume_operation::element<density_tests::TestObject<128ul,8ul>>
                   ((reentrant_consume_operation *)i_consume);
  TestObject<128UL,_8UL>::check(this);
  return;
}

Assistant:

static void
              reentrant_consume(const typename QUEUE::reentrant_consume_operation & i_consume)
            {
                DENSITY_TEST_ASSERT(i_consume.complete_type().template is<ElementType>());
                i_consume.template element<ElementType>().check();
            }